

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O0

void __thiscall DHUDMessage::Draw(DHUDMessage *this,int bottom,int visibility)

{
  int iVar1;
  uint uVar2;
  float fVar3;
  uint local_64;
  int drawx;
  int fracpart;
  float intpart;
  int screen_height;
  int screen_width;
  int hudheight;
  int iStack_2c;
  bool clean;
  int i;
  int ystep;
  int y;
  int x;
  int yscale;
  int xscale;
  int visibility_local;
  int bottom_local;
  DHUDMessage *this_local;
  
  screen_width._3_1_ = 0;
  if ((this->VisibilityFlags & visibility) == 0) {
    yscale = visibility;
    xscale = bottom;
    _visibility_local = this;
    (*(this->super_DObject)._vptr_DObject[8])();
    intpart = (float)DCanvas::GetWidth((DCanvas *)screen);
    fracpart = DCanvas::GetHeight((DCanvas *)screen);
    if ((this->HUDWidth == 0) && (iVar1 = active_con_scaletext(), iVar1 == 0)) {
      screen_width._3_1_ = 1;
      x = CleanXfac;
      y = CleanYfac;
    }
    else {
      y = 1;
      x = 1;
      if (this->HUDWidth == 0) {
        iVar1 = active_con_scaletext();
        intpart = (float)((int)intpart / iVar1);
        iVar1 = active_con_scaletext();
        fracpart = fracpart / iVar1;
        iVar1 = active_con_scaletext();
        xscale = xscale / iVar1;
      }
    }
    if (this->HUDWidth == 0) {
      if (this->Left <= 0.0) {
        fVar3 = (float)(int)intpart * -this->Left;
      }
      else {
        fVar3 = (float)((int)intpart - this->Width * x) * this->Left;
      }
      ystep = (int)fVar3;
      if (this->Top <= 0.0) {
        fVar3 = (float)xscale * -this->Top;
      }
      else {
        fVar3 = (float)(xscale - this->Height * y) * this->Top;
      }
      i = (int)fVar3;
    }
    else {
      fVar3 = modff(this->Left,(float *)&drawx);
      ystep = (int)(float)drawx;
      uVar2 = (int)(ABS(fVar3) * 10.0 + 0.5) & 3;
      if (uVar2 == 0) {
        ystep = ystep - this->Width / 2;
      }
      else if (uVar2 == 2) {
        ystep = ystep - this->Width;
      }
      fVar3 = modff(this->Top,(float *)&drawx);
      i = (int)(float)drawx;
      uVar2 = (int)(ABS(fVar3) * 10.0 + 0.5) & 3;
      if (uVar2 == 0) {
        i = i - this->Height / 2;
      }
      else if (uVar2 == 2) {
        i = i - this->Height;
      }
    }
    if ((this->CenterX & 1U) != 0) {
      ystep = (this->Width * x) / 2 + ystep;
    }
    iStack_2c = FFont::GetHeight(this->Font);
    iStack_2c = iStack_2c * y;
    if (this->HUDHeight < 0) {
      screen_height = -this->HUDHeight;
    }
    else {
      screen_height = ::Scale(this->HUDHeight,fracpart,xscale);
    }
    CalcClipCoords(this,screen_height);
    for (hudheight = 0; hudheight < this->NumLines; hudheight = hudheight + 1) {
      if ((this->CenterX & 1U) == 0) {
        local_64 = ystep;
      }
      else {
        local_64 = ystep - (this->Lines[hudheight].Width * x) / 2;
      }
      (*(this->super_DObject)._vptr_DObject[9])
                (this,(ulong)(uint)hudheight,(ulong)local_64,(ulong)(uint)i,
                 (ulong)(screen_width._3_1_ & 1),(ulong)(uint)screen_height);
      i = iStack_2c + i;
    }
  }
  return;
}

Assistant:

void DHUDMessage::Draw (int bottom, int visibility)
{
	int xscale, yscale;
	int x, y;
	int ystep;
	int i;
	bool clean = false;
	int hudheight;

	// If any of the visibility flags match, do NOT draw this message.
	if (VisibilityFlags & visibility)
	{
		return;
	}

	DrawSetup ();

	int screen_width = SCREENWIDTH;
	int screen_height = SCREENHEIGHT;
	if (HUDWidth == 0 && active_con_scaletext() == 0)
	{
		clean = true;
		xscale = CleanXfac;
		yscale = CleanYfac;
	}
	else
	{
		xscale = yscale = 1;
		if (HUDWidth == 0)
		{
			screen_width /= active_con_scaletext();
			screen_height /= active_con_scaletext();
			bottom /= active_con_scaletext();
		}
	}

	if (HUDWidth == 0)
	{
		if (Left > 0.f)
		{ // Position center
			x = (int)((float)(screen_width - Width * xscale) * Left);
		}
		else
		{ // Position edge
			x = (int)((float)screen_width * -Left);
		}
		if (Top > 0.f)
		{ // Position center
			y = (int)((float)(bottom - Height * yscale) * Top);
		}
		else
		{ // Position edge
			y = (int)((float)bottom * -Top);
		}
	}
	else
	{
		float intpart;
		int fracpart;

		fracpart = (int)(fabsf (modff (Left, &intpart)) * 10.f + 0.5f);
		x = (int)intpart;
		switch (fracpart & 3)
		{
		case 0: // Position center
			x -= Width / 2;
			break;

		case 2: // Position right
			x -= Width;
			break;
		}

		fracpart = (int)(fabsf (modff (Top, &intpart)) * 10.f + 0.5f);
		y = (int)intpart;
		switch (fracpart & 3)
		{
		case 0: // Position center
			y -= Height / 2;
			break;

		case 2: // Position bottom
			y -= Height;
			break;
		}
	}

	if (CenterX)
	{
		x += Width * xscale / 2;
	}

	ystep = Font->GetHeight() * yscale;

	if (HUDHeight < 0)
	{ // A negative height means the HUD size covers the status bar
		hudheight = -HUDHeight;
	}
	else
	{ // A positive height means the HUD size does not cover the status bar
		hudheight = Scale (HUDHeight, screen_height, bottom);
	}
	CalcClipCoords(hudheight);

	for (i = 0; i < NumLines; i++)
	{
		int drawx;

		drawx = CenterX ? x - Lines[i].Width*xscale/2 : x;
		DoDraw (i, drawx, y, clean, hudheight);
		y += ystep;
	}
}